

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_sse4.c
# Opt level: O0

void hbd_obmc_variance_w4
               (uint8_t *pre8,int pre_stride,int32_t *wsrc,int32_t *mask,uint64_t *sse,int64_t *sum,
               int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int32_t iVar4;
  long in_RCX;
  long in_RDX;
  int iVar5;
  longlong in_RSI;
  long in_RDI;
  long *in_R8;
  long *in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar7 [16];
  undefined8 extraout_XMM0_Qb_01;
  __m128i alVar8;
  __m128i v_val_d;
  __m128i v_d;
  __m128i v_sqrdiff_d;
  __m128i v_rdiff_d;
  __m128i v_diff_d;
  __m128i v_pm_d;
  __m128i v_p_d;
  __m128i v_w_d;
  __m128i v_m_d;
  __m128i v_p_w;
  __m128i v_sse_d;
  __m128i v_sum_d;
  int n;
  int pre_step;
  uint16_t *pre;
  undefined4 local_118;
  undefined8 local_110;
  longlong lVar6;
  
  iVar5 = (int)in_RSI;
  local_110 = in_RDI * 2;
  local_118 = 0;
  do {
    xx_loadl_64((void *)(local_110 + (long)local_118 * 2));
    xx_load_128((void *)(in_RCX + (long)local_118 * 4));
    alVar8 = xx_load_128((void *)(in_RDX + (long)local_118 * 4));
    auVar7._8_8_ = extraout_XMM0_Qb;
    auVar7._0_8_ = extraout_XMM0_Qa;
    auVar7 = pmovzxwd(auVar7,extraout_XMM0_Qa);
    auVar1._8_8_ = extraout_XMM0_Qb_00;
    auVar1._0_8_ = extraout_XMM0_Qa_00;
    pmaddwd(auVar7,auVar1);
    v_val_d[1] = in_RSI;
    v_val_d[0] = 0xc;
    lVar6 = 0xc;
    xx_roundn_epi32(v_val_d,(int)alVar8[1]);
    auVar3._8_8_ = extraout_XMM0_Qb_01;
    auVar3._0_8_ = extraout_XMM0_Qa_01;
    auVar2._8_8_ = extraout_XMM0_Qb_01;
    auVar2._0_8_ = extraout_XMM0_Qa_01;
    pmulld(auVar3,auVar2);
    local_118 = local_118 + 4;
    if (local_118 % 4 == 0) {
      local_110 = local_110 + (long)(iVar5 + -4) * 2;
    }
  } while (local_118 < (int)v_sqrdiff_d[1] * 4);
  alVar8[1] = in_RSI;
  alVar8[0] = lVar6;
  iVar4 = xx_hsum_epi32_si32(alVar8);
  *in_R9 = (long)iVar4;
  v_d[1] = in_RSI;
  v_d[0] = lVar6;
  iVar4 = xx_hsum_epi32_si32(v_d);
  *in_R8 = (long)iVar4;
  return;
}

Assistant:

static inline void hbd_obmc_variance_w4(
    const uint8_t *pre8, const int pre_stride, const int32_t *wsrc,
    const int32_t *mask, uint64_t *const sse, int64_t *const sum, const int h) {
  const uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  const int pre_step = pre_stride - 4;
  int n = 0;
  __m128i v_sum_d = _mm_setzero_si128();
  __m128i v_sse_d = _mm_setzero_si128();

  assert(IS_POWER_OF_TWO(h));

  do {
    const __m128i v_p_w = xx_loadl_64(pre + n);
    const __m128i v_m_d = xx_load_128(mask + n);
    const __m128i v_w_d = xx_load_128(wsrc + n);

    const __m128i v_p_d = _mm_cvtepu16_epi32(v_p_w);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m128i v_pm_d = _mm_madd_epi16(v_p_d, v_m_d);

    const __m128i v_diff_d = _mm_sub_epi32(v_w_d, v_pm_d);
    const __m128i v_rdiff_d = xx_roundn_epi32(v_diff_d, 12);
    const __m128i v_sqrdiff_d = _mm_mullo_epi32(v_rdiff_d, v_rdiff_d);

    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff_d);
    v_sse_d = _mm_add_epi32(v_sse_d, v_sqrdiff_d);

    n += 4;

    if (n % 4 == 0) pre += pre_step;
  } while (n < 4 * h);

  *sum = xx_hsum_epi32_si32(v_sum_d);
  *sse = xx_hsum_epi32_si32(v_sse_d);
}